

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

void PairSearchHelper(ON_RTreeNode *a_nodeA,ON_RTreeBranch *a_branchB,
                     ON_RTreePairSearchResult *a_result)

{
  int iVar1;
  bool bVar2;
  ON_2dex *pOVar3;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar4;
  int *piVar5;
  
  iVar1 = a_nodeA->m_count;
  if (0 < (long)iVar1) {
    paVar4 = &a_nodeA->m_branch[0].field_1;
    do {
      bVar2 = PairSearchOverlapHelper
                        ((ON_RTreeBBox *)(paVar4 + -6),&a_branchB->m_rect,a_result->m_tolerance);
      if (bVar2) {
        if (a_nodeA->m_level < 1) {
          pOVar3 = ON_SimpleArray<ON_2dex>::AppendNew(a_result->m_result);
          pOVar3->i = *(int *)paVar4;
          pOVar3->j = *(int *)&a_branchB->field_1;
        }
        else {
          PairSearchHelper(paVar4->m_child,a_branchB,a_result);
        }
      }
      piVar5 = (int *)(paVar4 + 1);
      paVar4 = paVar4 + 7;
    } while (piVar5 < a_nodeA->m_branch + iVar1);
  }
  return;
}

Assistant:

static void PairSearchHelper( const ON_RTreeNode* a_nodeA, const ON_RTreeBranch* a_branchB, ON_RTreePairSearchResult* a_result )
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;
  while(branchA < branchAmax)
  {
    if ( PairSearchOverlapHelper( &branchA->m_rect, &a_branchB->m_rect, a_result->m_tolerance ) )
    {
      if ( a_nodeA->m_level > 0 )
      {
        PairSearchHelper(branchA->m_child,a_branchB,a_result);
      }
      else
      {
        ON_2dex& r = a_result->m_result->AppendNew();
        r.i = (int)branchA->m_id;
        r.j = (int)a_branchB->m_id;
      }
    }
    branchA++;
  }
}